

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

ssize_t get_line_size(char *b,ssize_t avail,ssize_t *nlsize)

{
  char cVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  lVar3 = 0;
  if (0 < avail) {
    lVar3 = avail;
  }
  do {
    if (lVar3 == lVar2) {
LAB_003eeb5e:
      if (nlsize == (ssize_t *)0x0) {
        return avail;
      }
      *nlsize = 0;
      return avail;
    }
    cVar1 = b[lVar2];
    if (cVar1 == '\r') {
      if ((1 < avail - lVar2) && (b[lVar2 + 1] == '\n')) {
        if (nlsize != (ssize_t *)0x0) {
          *nlsize = 2;
        }
        return lVar2 + 2;
      }
LAB_003eeb48:
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 1;
      }
      return lVar2 + 1;
    }
    if (cVar1 == '\n') goto LAB_003eeb48;
    if (cVar1 == '\0') {
      avail = -1;
      goto LAB_003eeb5e;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static ssize_t
get_line_size(const char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (*b) {
		case '\0':/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		default:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}